

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O1

void __thiscall
Imf_3_4::DeepScanLineInputFile::Data::prepFillList
          (Data *this,DeepFrameBuffer *fb,
          vector<Imf_3_4::DeepSlice,_std::allocator<Imf_3_4::DeepSlice>_> *fill)

{
  pointer *ppDVar1;
  _Base_ptr __args;
  pointer pDVar2;
  iterator __position;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  undefined4 uVar7;
  _Rb_tree_color _Var8;
  undefined4 uVar9;
  Slice *pSVar10;
  const_iterator cVar11;
  ConstIterator CVar12;
  exr_attr_chlist_entry_t *peVar13;
  ostream *poVar14;
  char *pcVar15;
  ArgExc *pAVar16;
  stringstream _iex_throw_s;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  pSVar10 = DeepFrameBuffer::getSampleCountSlice(fb);
  pDVar2 = (fill->super__Vector_base<Imf_3_4::DeepSlice,_std::allocator<Imf_3_4::DeepSlice>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((fill->super__Vector_base<Imf_3_4::DeepSlice,_std::allocator<Imf_3_4::DeepSlice>_>)._M_impl.
      super__Vector_impl_data._M_finish != pDVar2) {
    (fill->super__Vector_base<Imf_3_4::DeepSlice,_std::allocator<Imf_3_4::DeepSlice>_>)._M_impl.
    super__Vector_impl_data._M_finish = pDVar2;
  }
  if (pSVar10->base != (char *)0x0) {
    cVar11._M_node = (_Base_ptr)DeepFrameBuffer::begin(fb);
    do {
      CVar12 = DeepFrameBuffer::end(fb);
      if ((const_iterator)cVar11._M_node == CVar12._i._M_node) {
        return;
      }
      peVar13 = Context::findChannel(this->_ctxt,this->partNumber,(char *)(cVar11._M_node + 1));
      if (peVar13 == (exr_attr_chlist_entry_t *)0x0) {
        __args = cVar11._M_node + 9;
        __position._M_current =
             (fill->super__Vector_base<Imf_3_4::DeepSlice,_std::allocator<Imf_3_4::DeepSlice>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (fill->super__Vector_base<Imf_3_4::DeepSlice,_std::allocator<Imf_3_4::DeepSlice>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<Imf_3_4::DeepSlice,std::allocator<Imf_3_4::DeepSlice>>::
          _M_realloc_insert<Imf_3_4::DeepSlice_const&>
                    ((vector<Imf_3_4::DeepSlice,std::allocator<Imf_3_4::DeepSlice>> *)fill,
                     __position,(DeepSlice *)__args);
        }
        else {
          *(_Base_ptr *)&((__position._M_current)->super_Slice).xTileCoords =
               cVar11._M_node[10]._M_left;
          _Var8 = __args->_M_color;
          uVar9 = *(undefined4 *)&__args->field_0x4;
          p_Var3 = cVar11._M_node[9]._M_parent;
          p_Var4 = cVar11._M_node[9]._M_left;
          p_Var5 = cVar11._M_node[9]._M_right;
          uVar7 = *(undefined4 *)&cVar11._M_node[10].field_0x4;
          p_Var6 = cVar11._M_node[10]._M_parent;
          ((__position._M_current)->super_Slice).xSampling = cVar11._M_node[10]._M_color;
          ((__position._M_current)->super_Slice).ySampling = uVar7;
          ((__position._M_current)->super_Slice).fillValue = (double)p_Var6;
          ((__position._M_current)->super_Slice).xStride = (size_t)p_Var4;
          ((__position._M_current)->super_Slice).yStride = (size_t)p_Var5;
          ((__position._M_current)->super_Slice).type = _Var8;
          *(undefined4 *)&((__position._M_current)->super_Slice).field_0x4 = uVar9;
          ((__position._M_current)->super_Slice).base = (char *)p_Var3;
          ppDVar1 = &(fill->
                     super__Vector_base<Imf_3_4::DeepSlice,_std::allocator<Imf_3_4::DeepSlice>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppDVar1 = *ppDVar1 + 1;
        }
      }
      else if ((peVar13->x_sampling != cVar11._M_node[10]._M_color) ||
              (peVar13->y_sampling != *(int *)&cVar11._M_node[10].field_0x4)) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream(local_1b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a0,"X and/or y subsampling factors of \"",0x23);
        poVar14 = std::operator<<(local_1a0,(char *)(cVar11._M_node + 1));
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar14,"\" channel of input file \"",0x19);
        pcVar15 = Context::fileName(this->_ctxt);
        poVar14 = std::operator<<(poVar14,pcVar15);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar14,"\" are not compatible with the frame buffer\'s subsampling factors.",
                   0x41);
        pAVar16 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::ArgExc::ArgExc(pAVar16,local_1b0);
        __cxa_throw(pAVar16,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
      }
      cVar11._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar11._M_node);
    } while( true );
  }
  pAVar16 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(pAVar16,"Invalid base pointer, please set a proper sample count slice.");
  __cxa_throw(pAVar16,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

void DeepScanLineInputFile::Data::prepFillList (
    const DeepFrameBuffer &fb, std::vector<DeepSlice> &fill)
{
    const Slice& sampleCountSlice = fb.getSampleCountSlice ();

    fill.clear ();

    if (!sampleCountSlice.base)
    {
        throw IEX_NAMESPACE::ArgExc (
            "Invalid base pointer, please set a proper sample count slice.");
    }

    for (DeepFrameBuffer::ConstIterator j = fb.begin (); j != fb.end (); ++j)
    {
        const exr_attr_chlist_entry_t* curc = _ctxt->findChannel (
            partNumber, j.name ());

        if (!curc)
        {
            fill.push_back (j.slice ());
            continue;
        }

        if (curc->x_sampling != j.slice ().xSampling ||
            curc->y_sampling != j.slice ().ySampling)
            THROW (
                IEX_NAMESPACE::ArgExc,
                "X and/or y subsampling factors "
                "of \""
                    << j.name ()
                    << "\" channel "
                       "of input file \""
                    << _ctxt->fileName ()
                    << "\" are "
                       "not compatible with the frame buffer's "
                       "subsampling factors.");
    }
}